

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

void * duckdb_miniz::tdefl_write_image_to_png_file_in_memory_ex
                 (void *pImage,int w,int h,int num_chans,size_t *pLen_out,mz_uint level,mz_bool flip
                 )

{
  size_t *psVar1;
  int iVar2;
  int iVar3;
  tdefl_status tVar4;
  mz_bool mVar5;
  tdefl_compressor *d;
  ulong uVar6;
  size_t sVar7;
  mz_ulong mVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  tdefl_output_buffer out_buf;
  mz_uint8 pnghdr [41];
  int local_ac;
  ulong local_a8;
  int local_a0;
  int local_9c;
  long local_98;
  ulong uStack_90;
  tdefl_compressor *local_88;
  undefined8 uStack_80;
  tdefl_put_buf_func_ptr local_78;
  undefined8 uStack_70;
  int6 local_68;
  undefined1 uStack_62;
  undefined1 uStack_61;
  undefined1 uStack_60;
  mz_uint8 mStack_5f;
  undefined1 auStack_5e [6];
  undefined1 uStack_58;
  undefined8 local_57;
  size_t *local_40;
  void *local_38;
  
  local_38 = pImage;
  d = (tdefl_compressor *)malloc(0x4df78);
  *pLen_out = 0;
  if (d != (tdefl_compressor *)0x0) {
    iVar10 = num_chans * w;
    local_88 = (tdefl_compressor *)0x0;
    local_98 = 0;
    uStack_80 = 1;
    iVar2 = (iVar10 + 1) * h;
    iVar11 = 0x40;
    if (0x40 < iVar2) {
      iVar11 = iVar2;
    }
    uStack_90 = (ulong)(iVar11 + 0x39);
    local_a8 = (ulong)(uint)h;
    local_9c = w;
    local_88 = (tdefl_compressor *)malloc(uStack_90);
    if (local_88 != (tdefl_compressor *)0x0) {
      local_ac = 0x29;
      local_a0 = num_chans;
      local_40 = pLen_out;
      do {
        tdefl_output_buffer_putter(&local_ac,1,&local_98);
        local_ac = local_ac + -1;
      } while (local_ac != 0);
      uVar6 = 10;
      if (level < 10) {
        uVar6 = (ulong)level;
      }
      tdefl_init(d,tdefl_output_buffer_putter,&local_98,
                 tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar6] | 0x1000)
      ;
      if (0 < (int)local_a8) {
        iVar2 = 0;
        iVar11 = (int)local_a8;
        do {
          iVar11 = iVar11 + -1;
          local_78 = (tdefl_put_buf_func_ptr)0x1;
          tdefl_compress(d,&local_ac,(size_t *)&local_78,(void *)0x0,(size_t *)0x0,TDEFL_NO_FLUSH);
          iVar3 = iVar11;
          if (flip == 0) {
            iVar3 = iVar2;
          }
          local_78 = (tdefl_put_buf_func_ptr)(long)iVar10;
          tdefl_compress(d,(void *)((long)(iVar3 * iVar10) + (long)local_38),(size_t *)&local_78,
                         (void *)0x0,(size_t *)0x0,TDEFL_NO_FLUSH);
          iVar2 = iVar2 + 1;
        } while (iVar11 != 0);
      }
      local_78 = (tdefl_put_buf_func_ptr)0x0;
      tVar4 = tdefl_compress(d,(void *)0x0,(size_t *)&local_78,(void *)0x0,(size_t *)0x0,
                             TDEFL_FINISH);
      psVar1 = local_40;
      if (tVar4 == TDEFL_STATUS_DONE) {
        sVar7 = local_98 - 0x29;
        *local_40 = sVar7;
        uStack_60 = 8;
        auStack_5e = (undefined1  [6])0x0;
        uStack_58 = 0;
        local_78 = (tdefl_put_buf_func_ptr)0xa1a0a0d474e5089;
        uStack_70 = (void *)0x524448490d000000;
        _local_68 = CONCAT17((char)local_a8,
                             CONCAT16((char)(local_a8 >> 8),
                                      (uint6)CONCAT11((char)local_9c,(char)((uint)local_9c >> 8)) <<
                                      0x10));
        mStack_5f = ""[local_a0];
        local_57 = CONCAT44(0x54414449,
                            CONCAT13((char)sVar7,
                                     CONCAT12((char)(sVar7 >> 8),
                                              CONCAT11((char)(sVar7 >> 0x10),(char)(sVar7 >> 0x18)))
                                    ));
        mVar8 = mz_crc32(0,(mz_uint8 *)((long)&uStack_70 + 4),0x11);
        lVar9 = 0x1d;
        do {
          *(char *)((long)&local_78 + lVar9) = (char)(mVar8 >> 0x18);
          mVar8 = (mz_ulong)(uint)((int)mVar8 << 8);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x21);
        *(ulong *)((long)local_88->m_max_probes + 5) =
             CONCAT17(uStack_58,CONCAT61(auStack_5e,mStack_5f));
        *(undefined8 *)((long)&local_88->m_adler32 + 1) = local_57;
        local_88->m_flags = (undefined4)local_68;
        local_88->m_max_probes[0] = stack0xffffffffffffff9c;
        *(ulong *)(local_88->m_max_probes + 1) = CONCAT62(auStack_5e,CONCAT11(mStack_5f,uStack_60));
        local_88->m_pPut_buf_func = local_78;
        local_88->m_pPut_buf_user = uStack_70;
        mVar5 = tdefl_output_buffer_putter("",0x10,&local_98);
        if (mVar5 != 0) {
          lVar9 = 0;
          mVar8 = mz_crc32(0,(mz_uint8 *)((long)&local_88->m_lookahead_pos + 1),*psVar1 + 4);
          do {
            *(char *)((long)local_88->m_max_probes + lVar9 + local_98 + -0x24) =
                 (char)(mVar8 >> 0x18);
            lVar9 = lVar9 + 1;
            mVar8 = (mz_ulong)(uint)((int)mVar8 << 8);
          } while (lVar9 != 4);
          *psVar1 = *psVar1 + 0x39;
          free(d);
          return local_88;
        }
        *psVar1 = 0;
      }
      free(d);
      d = local_88;
    }
    free(d);
  }
  return (void *)0x0;
}

Assistant:

void *tdefl_write_image_to_png_file_in_memory_ex(const void *pImage, int w, int h, int num_chans, size_t *pLen_out, mz_uint level, mz_bool flip)
{
    /* Using a local copy of this array here in case MINIZ_NO_ZLIB_APIS was defined. */
    static const mz_uint s_tdefl_png_num_probes[11] = { 0, 1, 6, 32, 16, 32, 128, 256, 512, 768, 1500 };
    tdefl_compressor *pComp = (tdefl_compressor *)MZ_MALLOC(sizeof(tdefl_compressor));
    tdefl_output_buffer out_buf;
    int i, bpl = w * num_chans, y, z;
    mz_uint32 c;
    *pLen_out = 0;
    if (!pComp)
        return NULL;
    MZ_CLEAR_OBJ(out_buf);
    out_buf.m_expandable = MZ_TRUE;
    out_buf.m_capacity = 57 + MZ_MAX(64, (1 + bpl) * h);
    if (NULL == (out_buf.m_pBuf = (mz_uint8 *)MZ_MALLOC(out_buf.m_capacity)))
    {
        MZ_FREE(pComp);
        return NULL;
    }
    /* write dummy header */
    for (z = 41; z; --z)
        tdefl_output_buffer_putter(&z, 1, &out_buf);
    /* compress image data */
    tdefl_init(pComp, tdefl_output_buffer_putter, &out_buf, s_tdefl_png_num_probes[MZ_MIN(10, level)] | TDEFL_WRITE_ZLIB_HEADER);
    for (y = 0; y < h; ++y)
    {
        tdefl_compress_buffer(pComp, &z, 1, TDEFL_NO_FLUSH);
        tdefl_compress_buffer(pComp, (mz_uint8 *)pImage + (flip ? (h - 1 - y) : y) * bpl, bpl, TDEFL_NO_FLUSH);
    }
    if (tdefl_compress_buffer(pComp, NULL, 0, TDEFL_FINISH) != TDEFL_STATUS_DONE)
    {
        MZ_FREE(pComp);
        MZ_FREE(out_buf.m_pBuf);
        return NULL;
    }
    /* write real header */
    *pLen_out = out_buf.m_size - 41;
    {
        static const mz_uint8 chans[] = { 0x00, 0x00, 0x04, 0x02, 0x06 };
        mz_uint8 pnghdr[41] = { 0x89, 0x50, 0x4e, 0x47, 0x0d,
                                0x0a, 0x1a, 0x0a, 0x00, 0x00,
                                0x00, 0x0d, 0x49, 0x48, 0x44,
                                0x52, 0x00, 0x00, 0x00, 0x00,
                                0x00, 0x00, 0x00, 0x00, 0x08,
                                0x00, 0x00, 0x00, 0x00, 0x00,
                                0x00, 0x00, 0x00, 0x00, 0x00,
                                0x00, 0x00, 0x49, 0x44, 0x41,
                                0x54 };
        pnghdr[18] = (mz_uint8)(w >> 8);
        pnghdr[19] = (mz_uint8)w;
        pnghdr[22] = (mz_uint8)(h >> 8);
        pnghdr[23] = (mz_uint8)h;
        pnghdr[25] = chans[num_chans];
        pnghdr[33] = (mz_uint8)(*pLen_out >> 24);
        pnghdr[34] = (mz_uint8)(*pLen_out >> 16);
        pnghdr[35] = (mz_uint8)(*pLen_out >> 8);
        pnghdr[36] = (mz_uint8)*pLen_out;
        c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, pnghdr + 12, 17);
        for (i = 0; i < 4; ++i, c <<= 8)
            ((mz_uint8 *)(pnghdr + 29))[i] = (mz_uint8)(c >> 24);
        memcpy(out_buf.m_pBuf, pnghdr, 41);
    }
    /* write footer (IDAT CRC-32, followed by IEND chunk) */
    if (!tdefl_output_buffer_putter("\0\0\0\0\0\0\0\0\x49\x45\x4e\x44\xae\x42\x60\x82", 16, &out_buf))
    {
        *pLen_out = 0;
        MZ_FREE(pComp);
        MZ_FREE(out_buf.m_pBuf);
        return NULL;
    }
    c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, out_buf.m_pBuf + 41 - 4, *pLen_out + 4);
    for (i = 0; i < 4; ++i, c <<= 8)
        (out_buf.m_pBuf + out_buf.m_size - 16)[i] = (mz_uint8)(c >> 24);
    /* compute final size of file, grab compressed data buffer and return */
    *pLen_out += 57;
    MZ_FREE(pComp);
    return out_buf.m_pBuf;
}